

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LDLt(TPZMatrix<std::complex<double>_> *this)

{
  byte bVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  double in_XMM1_Qa;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  double local_80;
  undefined1 local_78 [16];
  ulong local_68;
  undefined1 local_60 [16];
  ulong local_50;
  ulong local_48;
  double local_40;
  undefined8 local_38;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar4 = (this->super_TPZBaseMatrix).fRow;
  if (lVar4 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar4 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar4) {
    uVar5 = (ulong)((uint)lVar4 & 0x7fffffff);
    local_68 = 1;
    uVar3 = 0;
    local_48 = uVar5;
    do {
      if (uVar3 == 0) {
        local_a8 = ZEXT816(0);
      }
      else {
        local_a8 = ZEXT816(0);
        uVar6 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar6);
          local_98 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          local_80 = in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar3);
          in_XMM1_Qa = -in_XMM1_Qa;
          local_b8._8_8_ = local_80;
          local_b8._0_8_ = local_98;
          local_60._8_8_ = in_XMM1_Qa;
          std::complex<double>::operator*=((complex<double> *)local_b8,(complex<double> *)local_60);
          local_98 = local_b8._0_8_;
          uStack_90 = local_b8._8_4_;
          uStack_8c = local_b8._12_4_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar3);
          local_b8._12_4_ = uStack_8c;
          local_b8._8_4_ = uStack_90;
          local_b8._0_8_ = local_98;
          local_78._8_8_ = in_XMM1_Qa;
          std::complex<double>::operator*=((complex<double> *)local_b8,(complex<double> *)local_78);
          dVar2 = (double)local_a8._8_8_ + (double)local_b8._8_8_;
          local_a8._8_4_ = SUB84(dVar2,0);
          local_a8._0_8_ = (double)local_a8._0_8_ + (double)local_b8._0_8_;
          local_a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_b8._8_4_ = SUB84(in_XMM1_Qa - (double)local_a8._8_8_,0);
      local_b8._0_8_ =
           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) - (double)local_a8._0_8_;
      local_b8._12_4_ = (int)((ulong)(in_XMM1_Qa - (double)local_a8._8_8_) >> 0x20);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar3,uVar3,local_b8);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_38 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      local_40 = in_XMM1_Qa;
      dVar2 = cabs((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      in_XMM1_Qa = 1e-12;
      if (ABS(dVar2) < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_50 = uVar3 + 1;
      uVar6 = local_68;
      if (local_50 < uVar5) {
        do {
          if (uVar3 == 0) {
            local_a8 = ZEXT816(0);
          }
          else {
            local_a8 = ZEXT816(0);
            uVar5 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar5,uVar5);
              local_98 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
              local_80 = in_XMM1_Qa;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar3,uVar5);
              in_XMM1_Qa = -in_XMM1_Qa;
              local_b8._8_8_ = local_80;
              local_b8._0_8_ = local_98;
              local_60._8_8_ = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)local_b8,(complex<double> *)local_60);
              local_98 = local_b8._0_8_;
              uStack_90 = local_b8._8_4_;
              uStack_8c = local_b8._12_4_;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar6,uVar5);
              local_b8._12_4_ = uStack_8c;
              local_b8._8_4_ = uStack_90;
              local_b8._0_8_ = local_98;
              local_78._8_8_ = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)local_b8,(complex<double> *)local_78);
              dVar2 = (double)local_a8._8_8_ + (double)local_b8._8_8_;
              local_a8._8_4_ = SUB84(dVar2,0);
              local_a8._0_8_ = (double)local_a8._0_8_ + (double)local_b8._0_8_;
              local_a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar3);
          in_XMM1_Qa = in_XMM1_Qa - (double)local_a8._8_8_;
          local_b8._0_8_ =
               __divdc3(SUB84((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03) -
                              (double)local_a8._0_8_,0),in_XMM1_Qa,local_38,local_40);
          local_b8._8_8_ = in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar6,uVar3,local_b8);
          local_b8._8_8_ = -(double)local_b8._8_8_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar3,uVar6,local_b8);
          uVar6 = uVar6 + 1;
          uVar5 = local_48;
        } while (uVar6 != local_48);
      }
      local_68 = local_68 + 1;
      uVar3 = local_50;
    } while (local_50 != uVar5);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}